

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O2

MMDB_lookup_result_s *
MMDB_lookup_string(MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,char *ipstr,
                  int *gai_error,int *mmdb_error)

{
  int iVar1;
  addrinfo *addresses;
  addrinfo *local_60;
  addrinfo local_58;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->entry).mmdb = (MMDB_s *)0x0;
  local_60 = (addrinfo *)0x0;
  *(undefined8 *)&(__return_storage_ptr__->entry).offset = 0;
  *(undefined8 *)&__return_storage_ptr__->netmask = 0;
  (__return_storage_ptr__->entry).mmdb = mmdb;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_flags = 4;
  local_58.ai_family = 0;
  local_58.ai_socktype = 1;
  local_58.ai_protocol = 0;
  iVar1 = getaddrinfo(ipstr,(char *)0x0,&local_58,&local_60);
  *gai_error = iVar1;
  if (iVar1 == 0) {
    MMDB_lookup_sockaddr(__return_storage_ptr__,mmdb,(sockaddr *)local_60->ai_addr,mmdb_error);
  }
  if (local_60 != (addrinfo *)0x0) {
    freeaddrinfo(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

MMDB_lookup_result_s MMDB_lookup_string(const MMDB_s *const mmdb,
                                        const char *const ipstr,
                                        int *const gai_error,
                                        int *const mmdb_error) {
    MMDB_lookup_result_s result = {.found_entry = false,
                                   .netmask = 0,
                                   .entry = {.mmdb = mmdb, .offset = 0}};

    struct addrinfo *addresses = NULL;
    *gai_error = resolve_any_address(ipstr, &addresses);

    if (!*gai_error) {
        result = MMDB_lookup_sockaddr(mmdb, addresses->ai_addr, mmdb_error);
    }

    if (NULL != addresses) {
        freeaddrinfo(addresses);
    }

    return result;
}